

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_checked.hh
# Opt level: O0

Roaring * __thiscall doublechecked::Roaring::operator&=(Roaring *this,Roaring *r)

{
  const_iterator __position;
  bool bVar1;
  reference puVar2;
  const_iterator in_RDI;
  iterator r_it;
  iterator it;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  uint in_stack_ffffffffffffff94;
  uint in_stack_ffffffffffffff98;
  uint in_stack_ffffffffffffff9c;
  const_iterator in_stack_ffffffffffffffa8;
  _Self local_30;
  _Self local_28;
  _Self local_20;
  _Self local_18 [3];
  
  roaring::Roaring::operator&=
            ((Roaring *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
             (Roaring *)in_stack_ffffffffffffff88);
  local_18[0]._M_node =
       (_Base_ptr)
       std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::begin
                 (in_stack_ffffffffffffff88);
  local_20._M_node =
       (_Base_ptr)
       std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::begin
                 (in_stack_ffffffffffffff88);
  while( true ) {
    local_28._M_node =
         (_Base_ptr)
         std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::end
                   (in_stack_ffffffffffffff88);
    bVar1 = std::operator!=(local_18,&local_28);
    in_stack_ffffffffffffff9c = in_stack_ffffffffffffff9c & 0xffffff;
    if (bVar1) {
      local_30._M_node =
           (_Base_ptr)
           std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::end
                     (in_stack_ffffffffffffff88);
      bVar1 = std::operator!=(&local_20,&local_30);
      in_stack_ffffffffffffff9c = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff9c);
    }
    if ((char)(in_stack_ffffffffffffff9c >> 0x18) == '\0') break;
    puVar2 = std::_Rb_tree_const_iterator<unsigned_int>::operator*
                       ((_Rb_tree_const_iterator<unsigned_int> *)0x110f06);
    in_stack_ffffffffffffff98 = *puVar2;
    puVar2 = std::_Rb_tree_const_iterator<unsigned_int>::operator*
                       ((_Rb_tree_const_iterator<unsigned_int> *)0x110f16);
    if (in_stack_ffffffffffffff98 < *puVar2) {
      __position._M_node._4_4_ = in_stack_ffffffffffffff9c;
      __position._M_node._0_4_ = in_stack_ffffffffffffff98;
      local_18[0]._M_node =
           (_Base_ptr)
           std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>::
           erase_abi_cxx11_((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                             *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                            __position);
    }
    else {
      puVar2 = std::_Rb_tree_const_iterator<unsigned_int>::operator*
                         ((_Rb_tree_const_iterator<unsigned_int> *)0x110f59);
      in_stack_ffffffffffffff94 = *puVar2;
      puVar2 = std::_Rb_tree_const_iterator<unsigned_int>::operator*
                         ((_Rb_tree_const_iterator<unsigned_int> *)0x110f69);
      if (in_stack_ffffffffffffff94 < *puVar2) {
        std::_Rb_tree_const_iterator<unsigned_int>::operator++
                  ((_Rb_tree_const_iterator<unsigned_int> *)
                   CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
      }
      else {
        std::_Rb_tree_const_iterator<unsigned_int>::operator++
                  ((_Rb_tree_const_iterator<unsigned_int> *)
                   CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
        std::_Rb_tree_const_iterator<unsigned_int>::operator++
                  ((_Rb_tree_const_iterator<unsigned_int> *)
                   CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
      }
    }
  }
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::end
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
             &in_RDI._M_node[1]._M_parent);
  std::set<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>::erase_abi_cxx11_
            ((set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),in_stack_ffffffffffffffa8
             ,in_RDI);
  return (Roaring *)in_RDI._M_node;
}

Assistant:

Roaring &operator&=(const Roaring &r) {
        plain &= r.plain;

        auto it = check.begin();
        auto r_it = r.check.begin();
        while (it != check.end() && r_it != r.check.end()) {
            if (*it < *r_it) {
                it = check.erase(it);
            } else if (*r_it < *it) {
                ++r_it;
            } else {
                ++it;
                ++r_it;
            }  // overlapped
        }
        check.erase(it, check.end());  // erase rest of check not in r.check

        return *this;
    }